

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O1

void __thiscall
DCanvas::FillSimplePoly
          (DCanvas *this,FTexture *tex,FVector2 *points,int npoints,double originx,double originy,
          double scalex,double scaley,DAngle *rotation,FDynamicColormap *colormap,int lightlevel,
          int bottomclip)

{
  double dVar1;
  short sVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  uint uVar7;
  undefined8 uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  short sVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  lighttable_t *colormap_00;
  double dVar18;
  double dVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  double dVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  double local_90;
  double local_70;
  
  uVar8 = swrenderer::drawerargs::dc_destorg;
  if ((2 < npoints) && (this->Buffer != (BYTE *)0x0)) {
    dVar1 = rotation->Degrees;
    uVar22 = npoints - 1;
    uVar23 = 0;
    uVar13 = 1;
    uVar21 = 0;
    fVar25 = points->X;
    fVar27 = points->X;
    fVar30 = points->Y;
    fVar32 = points->Y;
    do {
      fVar33 = points[uVar13].Y;
      if (fVar33 < fVar30) {
        uVar23 = uVar13 & 0xffffffff;
      }
      fVar28 = points[uVar13].X;
      if (fVar32 < fVar33) {
        uVar21 = uVar13 & 0xffffffff;
      }
      fVar31 = fVar33;
      if (fVar30 <= fVar33) {
        fVar31 = fVar30;
      }
      if (fVar33 <= fVar32) {
        fVar33 = fVar32;
      }
      fVar26 = fVar28;
      if (fVar25 <= fVar28) {
        fVar26 = fVar25;
      }
      if (fVar28 <= fVar27) {
        fVar28 = fVar27;
      }
      uVar13 = uVar13 + 1;
      fVar25 = fVar26;
      fVar27 = fVar28;
      fVar30 = fVar31;
      fVar32 = fVar33;
    } while ((uint)npoints != uVar13);
    uVar6 = this->Height;
    if (0 < bottomclip) {
      uVar6 = bottomclip;
    }
    if ((((fVar31 < (float)(int)uVar6) && (0.0 < fVar33)) && (fVar26 < (float)this->Width)) &&
       (0.0 < fVar28)) {
      swrenderer::drawerargs::dc_destorg = (screen->super_DSimpleCanvas).super_DCanvas.Buffer;
      if (swrenderer::drawerargs::dc_destorg == (BYTE *)0x0) {
        I_FatalError("Attempt to write to buffer of hardware canvas");
      }
      dVar19 = (tex->Scale).X;
      dVar18 = (tex->Scale).Y;
      dVar3 = cos(rotation->Degrees * 0.017453292519943295);
      dVar4 = sin(rotation->Degrees * 0.017453292519943295);
      swrenderer::R_SetupSpanBits(tex);
      if (colormap == (FDynamicColormap *)0x0) {
        colormap_00 = &swrenderer::identitymap;
      }
      else {
        iVar15 = lightlevel * -0x4000 + 0x310000 >> 0x10;
        iVar16 = 0x1f;
        if (iVar15 < 0x1f) {
          iVar16 = iVar15;
        }
        iVar15 = 0;
        if (0 < iVar16) {
          iVar15 = iVar16;
        }
        colormap_00 = colormap->Maps + (uint)(iVar15 << 8);
      }
      swrenderer::R_SetSpanColormap(colormap_00);
      swrenderer::R_SetSpanSource(tex);
      local_90 = 0.0;
      swrenderer::drawerargs::ds_ystep = 0;
      swrenderer::drawerargs::ds_xstep = 0;
      local_70 = 0.0;
      if (swrenderer::drawerargs::ds_xbits != 0) {
        local_70 = (double)(uint)(1 << (-(char)swrenderer::drawerargs::ds_xbits & 0x1fU)) /
                   (scalex / dVar19);
        swrenderer::drawerargs::ds_xstep = SUB84(dVar3 * local_70 + 1.5e-08 + 6755399441055744.0,0);
      }
      if (swrenderer::drawerargs::ds_ybits != 0) {
        local_90 = (double)(uint)(1 << (-(char)swrenderer::drawerargs::ds_ybits & 0x1fU)) /
                   (scaley / dVar18);
        swrenderer::drawerargs::ds_ystep = SUB84(dVar4 * local_90 + 1.5e-08 + 6755399441055744.0,0);
      }
      iVar16 = (int)uVar23;
      uVar7 = iVar16 + 1;
      if ((int)uVar22 <= iVar16) {
        uVar7 = 0;
      }
      dVar19 = (double)(points[iVar16].Y + 0.5) + 1.5e-08 + 6755399441055744.0;
      sVar2 = (short)this->Width;
      dVar18 = dVar19;
      uVar13 = uVar23;
      do {
        dVar5 = (double)(points[(int)uVar7].Y + 0.5) + 1.5e-08 + 6755399441055744.0;
        uVar17 = SUB84(dVar18,0);
        uVar9 = SUB84(dVar5,0);
        if ((((int)uVar17 < (int)uVar9) && (-1 < (int)(uVar17 & uVar9))) &&
           (((int)uVar17 < (int)uVar6 || ((int)uVar9 < (int)uVar6)))) {
          uVar20 = uVar6;
          if ((int)uVar9 < (int)uVar6) {
            uVar20 = uVar9;
          }
          uVar9 = 0;
          if (0 < (int)uVar17) {
            uVar9 = uVar17;
          }
          if ((int)uVar9 < (int)uVar20) {
            iVar11 = SUB84((double)((points[(int)uVar7].X - points[(int)uVar13].X) /
                                   (points[(int)uVar7].Y - points[(int)uVar13].Y)) + 103079215104.0,
                           0);
            iVar15 = SUB84((double)(points[(int)uVar13].X + 0.5) + 103079215104.0,0) -
                     ((int)uVar17 >> 0x1f & uVar17 * iVar11);
            uVar13 = (ulong)uVar9;
            do {
              sVar14 = (short)((uint)iVar15 >> 0x10);
              if (sVar2 <= sVar14) {
                sVar14 = sVar2;
              }
              if (iVar15 < 0) {
                sVar14 = -1;
              }
              spanend[uVar13] = sVar14;
              iVar15 = iVar15 + iVar11;
              uVar13 = uVar13 + 1;
            } while (uVar20 != uVar13);
          }
        }
        uVar9 = uVar7 + 1;
        if ((int)uVar22 <= (int)uVar7) {
          uVar9 = 0;
        }
        uVar13 = (ulong)uVar7;
        bVar24 = uVar7 != (uint)uVar21;
        dVar18 = (double)((ulong)dVar5 & 0xffffffff);
        uVar7 = uVar9;
      } while (bVar24);
      uVar7 = iVar16 - 1;
      if (iVar16 < 1) {
        uVar7 = uVar22;
      }
      do {
        uVar13 = (ulong)uVar7;
        dVar18 = (double)(points[uVar13].Y + 0.5) + 1.5e-08 + 6755399441055744.0;
        uVar9 = SUB84(dVar19,0);
        uVar17 = SUB84(dVar18,0);
        if ((((int)uVar9 < (int)uVar17) && (-1 < (int)(uVar9 & uVar17))) &&
           (((int)uVar9 < (int)uVar6 || ((int)uVar17 < (int)uVar6)))) {
          uVar20 = uVar6;
          if ((int)uVar17 < (int)uVar6) {
            uVar20 = uVar17;
          }
          uVar17 = 0;
          if (0 < (int)uVar9) {
            uVar17 = uVar9;
          }
          if ((int)uVar17 < (int)uVar20) {
            iVar15 = SUB84((double)((points[uVar13].X - points[(int)uVar23].X) /
                                   (points[uVar13].Y - points[(int)uVar23].Y)) + 103079215104.0,0);
            iVar16 = SUB84((double)(points[(int)uVar23].X + 0.5) + 103079215104.0,0) -
                     ((int)uVar9 >> 0x1f & uVar9 * iVar15);
            uVar23 = (ulong)uVar17;
            do {
              iVar11 = (int)spanend[uVar23];
              if (((0 < spanend[uVar23]) && (iVar10 = iVar16 >> 0x10, iVar10 < iVar11)) &&
                 (iVar12 = this->Width, iVar10 < iVar12)) {
                if (iVar10 < 1) {
                  iVar10 = 0;
                }
                if (iVar11 < iVar12) {
                  iVar12 = iVar11;
                }
                swrenderer::drawerargs::ds_x2 = iVar12 + -1;
                swrenderer::drawerargs::ds_y = (int)uVar23;
                dVar5 = (double)iVar10 - originx;
                dVar19 = (double)swrenderer::drawerargs::ds_y - originy;
                if ((dVar1 != 0.0) || (dVar29 = dVar5, NAN(dVar1))) {
                  dVar29 = dVar3 * dVar5 - dVar4 * dVar19;
                  dVar19 = dVar19 * dVar3 + dVar5 * dVar4;
                }
                swrenderer::drawerargs::ds_xfrac =
                     SUB84(dVar29 * local_70 + 1.5e-08 + 6755399441055744.0,0);
                swrenderer::drawerargs::ds_yfrac =
                     SUB84(dVar19 * local_90 + 1.5e-08 + 6755399441055744.0,0);
                swrenderer::drawerargs::ds_x1 = iVar10;
                swrenderer::R_DrawSpan();
              }
              iVar16 = iVar16 + iVar15;
              uVar23 = uVar23 + 1;
            } while (uVar20 != uVar23);
          }
        }
        uVar9 = uVar7 - 1;
        if ((int)uVar7 < 1) {
          uVar9 = uVar22;
        }
        bVar24 = uVar7 != (uint)uVar21;
        uVar23 = uVar13;
        dVar19 = dVar18;
        uVar7 = uVar9;
      } while (bVar24);
    }
  }
  swrenderer::drawerargs::dc_destorg = (BYTE *)uVar8;
  return;
}

Assistant:

void DCanvas::FillSimplePoly(FTexture *tex, FVector2 *points, int npoints,
	double originx, double originy, double scalex, double scaley, DAngle rotation,
	FDynamicColormap *colormap, int lightlevel, int bottomclip)
{
#ifndef NO_SWRENDER
	using namespace swrenderer;
	using namespace drawerargs;

	// Use an equation similar to player sprites to determine shade
	fixed_t shade = LIGHT2SHADE(lightlevel) - 12*FRACUNIT;
	float topy, boty, leftx, rightx;
	int toppt, botpt, pt1, pt2;
	int i;
	int y1, y2, y;
	fixed_t x;
	bool dorotate = rotation != 0.;
	double cosrot, sinrot;

	if (--npoints < 2 || Buffer == NULL)
	{ // not a polygon or we're not locked
		return;
	}

	if (bottomclip <= 0)
	{
		bottomclip = Height;
	}

	// Find the extents of the polygon, in particular the highest and lowest points.
	for (botpt = toppt = 0, boty = topy = points[0].Y, leftx = rightx = points[0].X, i = 1; i <= npoints; ++i)
	{
		if (points[i].Y < topy)
		{
			topy = points[i].Y;
			toppt = i;
		}
		if (points[i].Y > boty)
		{
			boty = points[i].Y;
			botpt = i;
		}
		if (points[i].X < leftx)
		{
			leftx = points[i].X;
		}
		if (points[i].X > rightx)
		{
			rightx = points[i].X;
		}
	}
	if (topy >= bottomclip ||	// off the bottom of the screen
		boty <= 0 ||			// off the top of the screen
		leftx >= Width ||		// off the right of the screen
		rightx <= 0)			// off the left of the screen
	{
		return;
	}

	BYTE *destorgsave = dc_destorg;
	dc_destorg = screen->GetBuffer();
	if (dc_destorg == NULL)
	{
		I_FatalError("Attempt to write to buffer of hardware canvas");
	}

	scalex /= tex->Scale.X;
	scaley /= tex->Scale.Y;

	// Use the CRT's functions here.
	cosrot = cos(rotation.Radians());
	sinrot = sin(rotation.Radians());

	// Setup constant texture mapping parameters.
	R_SetupSpanBits(tex);
	R_SetSpanColormap(colormap != NULL ? &colormap->Maps[clamp(shade >> FRACBITS, 0, NUMCOLORMAPS-1) * 256] : identitymap);
	R_SetSpanSource(tex);
	if (ds_xbits != 0)
	{
		scalex = double(1u << (32 - ds_xbits)) / scalex;
		ds_xstep = xs_RoundToInt(cosrot * scalex);
	}
	else
	{ // Texture is one pixel wide.
		scalex = 0;
		ds_xstep = 0;
	}
	if (ds_ybits != 0)
	{
		scaley = double(1u << (32 - ds_ybits)) / scaley;
		ds_ystep = xs_RoundToInt(sinrot * scaley);
	}
	else
	{ // Texture is one pixel tall.
		scaley = 0;
		ds_ystep = 0;
	}

	// Travel down the right edge and create an outline of that edge.
	pt1 = toppt;
	pt2 = toppt + 1;	if (pt2 > npoints) pt2 = 0;
	y1 = xs_RoundToInt(points[pt1].Y + 0.5f);
	do
	{
		x = FLOAT2FIXED(points[pt1].X + 0.5f);
		y2 = xs_RoundToInt(points[pt2].Y + 0.5f);
		if (y1 >= y2 || (y1 < 0 && y2 < 0) || (y1 >= bottomclip && y2 >= bottomclip))
		{
		}
		else
		{
			fixed_t xinc = FLOAT2FIXED((points[pt2].X - points[pt1].X) / (points[pt2].Y - points[pt1].Y));
			int y3 = MIN(y2, bottomclip);
			if (y1 < 0)
			{
				x += xinc * -y1;
				y1 = 0;
			}
			for (y = y1; y < y3; ++y)
			{
				spanend[y] = clamp<short>(x >> FRACBITS, -1, Width);
				x += xinc;
			}
		}
		y1 = y2;
		pt1 = pt2;
		pt2++;			if (pt2 > npoints) pt2 = 0;
	} while (pt1 != botpt);

	// Travel down the left edge and fill it in.
	pt1 = toppt;
	pt2 = toppt - 1;	if (pt2 < 0) pt2 = npoints;
	y1 = xs_RoundToInt(points[pt1].Y + 0.5f);
	do
	{
		x = FLOAT2FIXED(points[pt1].X + 0.5f);
		y2 = xs_RoundToInt(points[pt2].Y + 0.5f);
		if (y1 >= y2 || (y1 < 0 && y2 < 0) || (y1 >= bottomclip && y2 >= bottomclip))
		{
		}
		else
		{
			fixed_t xinc = FLOAT2FIXED((points[pt2].X - points[pt1].X) / (points[pt2].Y - points[pt1].Y));
			int y3 = MIN(y2, bottomclip);
			if (y1 < 0)
			{
				x += xinc * -y1;
				y1 = 0;
			}
			for (y = y1; y < y3; ++y)
			{
				int x1 = x >> FRACBITS;
				int x2 = spanend[y];
				if (x2 > x1 && x2 > 0 && x1 < Width)
				{
					x1 = MAX(x1, 0);
					x2 = MIN(x2, Width);
#if 0
					memset(this->Buffer + y * this->Pitch + x1, (int)tex, x2 - x1);
#else
					ds_y = y;
					ds_x1 = x1;
					ds_x2 = x2 - 1;

					DVector2 tex(x1 - originx, y - originy);
					if (dorotate)
					{
						double t = tex.X;
						tex.X = t * cosrot - tex.Y * sinrot;
						tex.Y = tex.Y * cosrot + t * sinrot;
					}
					ds_xfrac = xs_RoundToInt(tex.X * scalex);
					ds_yfrac = xs_RoundToInt(tex.Y * scaley);

					R_DrawSpan();
#endif
				}
				x += xinc;
			}
		}
		y1 = y2;
		pt1 = pt2;
		pt2--;			if (pt2 < 0) pt2 = npoints;
	} while (pt1 != botpt);
	dc_destorg = destorgsave;
#endif
}